

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O3

void __thiscall Saturation::SaturationAlgorithm::newClausesToUnprocessed(SaturationAlgorithm *this)

{
  Clause *cl;
  Clause **ppCVar1;
  uint uVar2;
  Clause **in_RAX;
  Clause **local_18;
  
  local_18 = in_RAX;
  if (*(char *)(Lib::env + 0x16b2) == '\x01') {
    local_18 = (this->_newClauses)._s._stack;
    Shell::Shuffling::shuffleArray<Kernel::Clause**&>
              (&local_18,(uint)((ulong)((long)(this->_newClauses)._s._cursor - (long)local_18) >> 3)
              );
  }
  while (ppCVar1 = (this->_newClauses)._s._cursor, ppCVar1 != (this->_newClauses)._s._stack) {
    (this->_newClauses)._s._cursor = ppCVar1 + -1;
    cl = ppCVar1[-1];
    uVar2 = *(uint *)&cl->field_0x38 >> 0x19 & 7;
    if (uVar2 == 3) {
      addUnprocessedClause(this,cl);
    }
    else if ((uVar2 == 0) && (this->_symEl != (SymElOutput *)0x0)) {
      SymElOutput::onNonRedundantClause(this->_symEl,cl);
    }
    cl->_refCnt = cl->_refCnt - 1;
    Kernel::Clause::destroyIfUnnecessary(cl);
  }
  return;
}

Assistant:

void SaturationAlgorithm::newClausesToUnprocessed()
{
  if (env.options->randomTraversals()) {
    TIME_TRACE(TimeTrace::SHUFFLING);

    Shuffling::shuffleArray(_newClauses.naked().begin(), _newClauses.size());
  }

  while (_newClauses.isNonEmpty()) {
    Clause* cl = _newClauses.popWithoutDec();
    switch (cl->store()) {
      case Clause::UNPROCESSED:
        break;
      case Clause::PASSIVE:
        onNonRedundantClause(cl);
        break;
      case Clause::NONE:
        addUnprocessedClause(cl);
        break;
      case Clause::SELECTED:
      case Clause::ACTIVE:
#if VDEBUG
        cout << "FAIL: " << cl->toString() << endl;
        // such clauses should not appear as new ones
        cout << cl->toString() << endl;
#endif
        ASSERTION_VIOLATION_REP(cl->store());
    }
    cl->decRefCnt(); // belongs to _newClauses.popWithoutDec()
  }
}